

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O0

String * __thiscall
kj::encodeHex(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> input)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  byte *pbVar5;
  char *pcVar6;
  unsigned_long i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> local_40;
  Range<unsigned_long> *local_30;
  Range<unsigned_long> *__range1;
  undefined1 local_20 [8];
  ArrayPtr<const_unsigned_char> input_local;
  String *result;
  
  input_local.ptr = input.ptr;
  __range1._7_1_ = 0;
  local_20 = (undefined1  [8])this;
  input_local.size_ = (size_t)__return_storage_ptr__;
  sVar3 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)local_20);
  heapString(__return_storage_ptr__,sVar3 * 2);
  local_40 = indices<kj::ArrayPtr<unsigned_char_const>&>((ArrayPtr<const_unsigned_char> *)local_20);
  local_30 = &local_40;
  __end1 = Range<unsigned_long>::begin(local_30);
  i = (unsigned_long)Range<unsigned_long>::end(local_30);
  while( true ) {
    bVar2 = Range<unsigned_long>::Iterator::operator==(&__end1,(Iterator *)&i);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    puVar4 = Range<unsigned_long>::Iterator::operator*(&__end1);
    sVar3 = *puVar4;
    pbVar5 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)local_20,sVar3);
    cVar1 = "0123456789abcdef"[*pbVar5 >> 4];
    pcVar6 = String::operator[](__return_storage_ptr__,sVar3 * 2);
    *pcVar6 = cVar1;
    pbVar5 = ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)local_20,sVar3);
    cVar1 = "0123456789abcdef"[*pbVar5 & 0xf];
    pcVar6 = String::operator[](__return_storage_ptr__,sVar3 * 2 + 1);
    *pcVar6 = cVar1;
    Range<unsigned_long>::Iterator::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

String encodeHex(ArrayPtr<const byte> input) {
  auto result = heapString(input.size() * 2);
  for (auto i: kj::indices(input)) {
    result[i*2] = HEX_DIGITS[input[i] / 16];
    result[i*2+1] = HEX_DIGITS[input[i] % 16];
  }
  return result;
}